

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<long_double>::GramSchmidt
          (TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *Orthog,
          TPZFMatrix<long_double> *TransfToOrthog)

{
  int64_t iVar1;
  int64_t iVar2;
  longdouble *plVar3;
  long *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar5;
  longdouble in_ST7;
  REAL RVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double __x;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  int64_t r_6;
  int64_t r_5;
  int64_t r_4;
  int64_t c_2;
  int64_t r_3;
  int64_t r_2;
  int64_t r_1;
  int64_t stop;
  int64_t c_1;
  longdouble dotDown;
  longdouble dotUp;
  int64_t c;
  int64_t r;
  int64_t QTDvec;
  int64_t QTDcomp;
  int64_t i;
  double norm;
  int64_t j;
  double scale;
  int64_t in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined6 in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb6;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  longdouble local_78;
  longdouble local_68;
  long local_58;
  long local_50;
  long local_38;
  double local_30;
  long local_28;
  double local_20;
  
  local_20 = 1.0;
  for (local_28 = 0; iVar1 = TPZBaseMatrix::Cols(in_RDI), local_28 < iVar1; local_28 = local_28 + 1)
  {
    local_30 = 0.0;
    for (local_38 = 0; iVar1 = TPZBaseMatrix::Rows(in_RDI), local_38 < iVar1;
        local_38 = local_38 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_38,local_28);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_38,local_28);
      lVar4 = in_ST7;
      lVar5 = in_ST7;
      RVar6 = TPZExtractVal::val(in_ST0 * in_ST1);
      local_30 = ABS(RVar6) + local_30;
      in_ST0 = in_ST2;
      in_ST1 = in_ST3;
      in_ST2 = in_ST4;
      in_ST3 = in_ST5;
      in_ST4 = in_ST6;
      in_ST5 = in_ST7;
      in_ST6 = lVar4;
      in_ST7 = lVar5;
    }
    dVar7 = sqrt(local_30);
    if ((1e-10 < dVar7) && (local_20 < 1.0 / dVar7)) {
      local_20 = 1.0 / dVar7;
    }
  }
  lVar4 = in_ST6;
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x26])();
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  iVar2 = TPZBaseMatrix::Cols(in_RDI);
  (**(code **)(*in_RSI + 0x68))(in_RSI,iVar1,iVar2);
  dVar7 = (double)(**(code **)(*in_RSI + 0x78))();
  for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
    for (local_58 = 0; local_58 < iVar2; local_58 = local_58 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_50,local_58);
      plVar3 = operator()((TPZFMatrix<long_double> *)
                          CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                          in_stack_fffffffffffffea0);
      *plVar3 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = lVar4;
      dVar7 = extraout_XMM0_Qa;
    }
  }
  for (local_80 = 1; local_80 < iVar2; local_80 = local_80 + 1) {
    for (local_88 = 0; local_88 < local_80; local_88 = local_88 + 1) {
      local_78 = (longdouble)0;
      lVar4 = in_ST0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      local_68 = local_78;
      for (local_90 = 0; local_90 < iVar1; local_90 = local_90 + 1) {
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_90,local_80);
        plVar3 = operator()((TPZFMatrix<long_double> *)
                            CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_68 = lVar4 * *plVar3 + local_68;
        plVar3 = operator()((TPZFMatrix<long_double> *)
                            CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        lVar4 = *plVar3;
        plVar3 = operator()((TPZFMatrix<long_double> *)
                            CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        local_78 = lVar4 * *plVar3 + local_78;
        lVar4 = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        dVar7 = extraout_XMM0_Qa_00;
      }
      in_ST5 = in_ST4;
      dVar7 = std::fabs(dVar7);
      if ((longdouble)1e-08 <= lVar4) {
        for (local_a0 = 0; in_ST6 = in_ST5, local_a0 < iVar1; local_a0 = local_a0 + 1) {
          plVar3 = operator()((TPZFMatrix<long_double> *)
                              CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          lVar4 = *plVar3;
          plVar3 = operator()((TPZFMatrix<long_double> *)
                              CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          *plVar3 = *plVar3 - (lVar4 * local_68) / local_78;
          dVar7 = extraout_XMM0_Qa_02;
        }
      }
      else {
        in_ST6 = in_ST5;
        for (local_98 = 0; local_98 < iVar1; local_98 = local_98 + 1) {
          plVar3 = operator()((TPZFMatrix<long_double> *)
                              CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                              CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                              in_stack_fffffffffffffea0);
          *plVar3 = (longdouble)0;
          dVar7 = extraout_XMM0_Qa_01;
        }
      }
    }
  }
  for (local_a8 = 0; local_a8 < iVar2; local_a8 = local_a8 + 1) {
    lVar4 = in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    for (local_b0 = 0; local_b0 < iVar1; local_b0 = local_b0 + 1) {
      operator()((TPZFMatrix<long_double> *)
                 CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0);
      operator()((TPZFMatrix<long_double> *)
                 CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 in_stack_fffffffffffffea0);
      in_ST4 = in_ST3;
      in_ST5 = in_ST3;
      dVar7 = extraout_XMM0_Qa_03;
    }
    dVar7 = std::fabs(dVar7);
    in_ST6 = in_ST5;
    if (lVar4 <= (longdouble)1e-08) {
      for (local_c0 = 0; local_c0 < iVar1; local_c0 = local_c0 + 1) {
        plVar3 = operator()((TPZFMatrix<long_double> *)
                            CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        *plVar3 = (longdouble)0;
        dVar7 = extraout_XMM0_Qa_05;
      }
    }
    else {
      for (local_b8 = 0; local_b8 < iVar1; local_b8 = local_b8 + 1) {
        plVar3 = operator()((TPZFMatrix<long_double> *)
                            CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        in_stack_fffffffffffffeac = SUB104(*plVar3,0);
        in_stack_fffffffffffffeb0 = (undefined6)((unkuint10)*plVar3 >> 0x20);
        std::sqrt(__x);
        lVar4 = (longdouble)CONCAT64(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
        lVar5 = in_ST6;
        plVar3 = operator()((TPZFMatrix<long_double> *)
                            CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
                            CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                            in_stack_fffffffffffffea0);
        *plVar3 = lVar4 / in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar5;
        dVar7 = extraout_XMM0_Qa_04;
      }
    }
  }
  (**(code **)(*in_RSI + 0x128))(in_RSI,in_RDI,in_RDX,1);
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x26])();
  (**(code **)(*in_RDX + 0x130))();
  return;
}

Assistant:

void TPZFMatrix<TVar>::GramSchmidt(TPZFMatrix<TVar> &Orthog, TPZFMatrix<TVar> &TransfToOrthog)
{
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value||
                  std::is_same<TVar,int>::value||
                  std::is_same<TVar,TPZFlopCounter>::value) {
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" not implemented for this type\n";
        PZError<<"Aborting...";
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print("GrSchmidt Entrada",sout);
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
    double scale = 1.;
    for(int64_t j = 0; j < this->Cols(); j++)
    {
        double norm = 0.;
        for(int64_t i = 0; i < this->Rows(); i++)
        {
            norm += fabs(TPZExtractVal::val(this->GetVal(i,j)*this->GetVal(i,j)));
        }
        norm = sqrt(norm);
        if(norm > 1.e-10)
        {
            if((1.)/norm > scale) scale = (1.)/norm;
        }
    }
    
    this->operator *=( scale );
    
    int64_t QTDcomp = this->Rows();
    int64_t QTDvec = this->Cols();
    Orthog.Resize(QTDcomp,QTDvec);
    Orthog.Zero();
    /// Making a copy of *this (Ortog = *this)
    for(int64_t r = 0; r < QTDcomp; r++)
    {
        for(int64_t c = 0; c < QTDvec; c++)
        {
            Orthog(r,c) = GetVal(r,c);
        }
    }
    
#ifdef PZDEBUG
    int check = 0;
    for(int64_t c = 0; c < QTDvec; c++)
    {
        TVar summ = 0.;
        for(int64_t r = 0; r < QTDcomp; r++)
        {
            summ += fabs(GetVal(r,c));
        }
        if(fabs(summ) < 0.00001)
        {
            std::stringstream sout;
            sout << "Null Vector on Gram-Schmidt Method! Col = " << c << "\n";
            LOGPZ_ERROR(logger,sout.str())
            check = 1;
        }
    }
#endif
    
    TVar dotUp, dotDown;
    for(int64_t c = 1; c < QTDvec; c++)
    {
        for(int64_t stop = 0; stop < c; stop++)
        {
            dotUp = 0.;
            dotDown = 0.;
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                dotUp += GetVal(r,c)*Orthog(r,stop);
                dotDown += Orthog(r,stop)*Orthog(r,stop);
            }
            if(fabs(dotDown) < 1.E-8)
            {
#ifdef PZDEBUG
                if(check == 0)
                {
                    std::stringstream sout;
                    sout << "Parallel Vectors on Gram-Schmidt Method! Col = " << stop << "\n";
                    LOGPZ_ERROR(logger,sout.str())
                }
#endif
                
                for(int64_t r = 0; r < QTDcomp; r++)
                {
                    Orthog(r,stop) = 0.;
                }
            }
            else
            {
#ifdef PZ_LOG2
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "dotdown = " << dotDown << " dotup = " << dotUp;
                    LOGPZ_DEBUG(logger,sout.str())
                }
#endif
                
                for(int64_t r = 0; r < QTDcomp; r++)
                {
                    Orthog(r,c) -= dotUp*Orthog(r,stop)/dotDown;
                }
            }
        }
    }
    for(int64_t c = 0; c < QTDvec; c++)
    {
        dotUp = 0.;
        for(int64_t r = 0; r < QTDcomp; r++)
        {
            dotUp += Orthog(r,c)*Orthog(r,c);
        }
        if(fabs(dotUp) > 1.e-8)
        {
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                Orthog(r,c) = Orthog(r,c)/sqrt(dotUp);
            }
        }
        else {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "Linearly dependent columns dotUp = " << dotUp;
            LOGPZ_ERROR(logger,sout.str())
#endif
            
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                Orthog(r,c) = 0.;
            }
        }
        
    }
    Orthog.Multiply(*this,TransfToOrthog,1);
    
    this->operator*= ( 1./scale );
    TransfToOrthog.operator*= ( 1./scale );
    
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << endl;
        sout << "Output GS" << endl;
        Orthog.Print("Orthog matrix",sout);
        TransfToOrthog.Print("TransfToOrthog matrix",sout);
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
#ifdef PZDEBUG
    TPZFNMatrix<9, TVar> OrthogT;
    Orthog.Transpose(&OrthogT);
    TPZAxesTools<TVar>::VerifyAxes(OrthogT);
#endif
}